

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

void __thiscall
Diligent::RefCntAutoPtr<Diligent::DeviceContextVkImpl>::Release
          (RefCntAutoPtr<Diligent::DeviceContextVkImpl> *this)

{
  if (this->m_pObject != (DeviceContextVkImpl *)0x0) {
    RefCountedObject<Diligent::IDeviceContextVk>::Release
              ((RefCountedObject<Diligent::IDeviceContextVk> *)this->m_pObject);
    this->m_pObject = (DeviceContextVkImpl *)0x0;
  }
  return;
}

Assistant:

void Release() noexcept
    {
        if (m_pObject)
        {
            m_pObject->Release();
            m_pObject = nullptr;
        }
    }